

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O0

void av1_scale_references(AV1_COMP *cpi,InterpFilter filter,int phase,int use_optimized_scaler)

{
  BufferPool *pBVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  YV12_BUFFER_CONFIG *pYVar6;
  RefCntBuffer *pRVar7;
  int in_ECX;
  int in_EDX;
  InterpFilter in_SIL;
  AV1_COMP *in_RDI;
  RefCntBuffer *buf;
  int in_stack_00000050;
  _Bool has_optimized_scaler;
  int new_fb_idx;
  RefCntBuffer *new_fb;
  int in_stack_00000060;
  int force_scaling;
  RefCntBuffer *ref_fb;
  YV12_BUFFER_CONFIG *ref;
  BufferPool *pool;
  MV_REFERENCE_FRAME ref_frame;
  int num_planes;
  AV1_COMMON *cm;
  int in_stack_000000b0;
  int in_stack_000000b8;
  aom_codec_frame_buffer_t *in_stack_000000c0;
  aom_get_frame_buffer_cb_fn_t in_stack_000000c8;
  void *in_stack_000000d0;
  int in_stack_000000e0;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffff5c;
  MV_REFERENCE_FRAME ref_frame_00;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  AV1_COMMON *in_stack_ffffffffffffff70;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar11;
  undefined4 in_stack_ffffffffffffff8c;
  _Bool local_61;
  _Bool local_55;
  RefCntBuffer *local_50;
  char local_25;
  
  iVar4 = av1_num_planes(&in_RDI->common);
  for (local_25 = '\x01'; local_25 < '\b'; local_25 = local_25 + '\x01') {
    if ((in_RDI->ref_frame_flags & (uint)""[local_25]) == 0) {
      iVar5 = has_no_stats_stage(in_RDI);
      if (iVar5 == 0) {
        in_RDI->scaled_ref_buf[local_25 + -1] = (RefCntBuffer *)0x0;
      }
    }
    else {
      pBVar1 = (in_RDI->common).buffer_pool;
      pYVar6 = get_ref_frame_yv12_buf
                         (in_stack_ffffffffffffff70,
                          (MV_REFERENCE_FRAME)((ulong)in_stack_ffffffffffffff68 >> 0x38));
      if (pYVar6 == (YV12_BUFFER_CONFIG *)0x0) {
        in_RDI->scaled_ref_buf[local_25 + -1] = (RefCntBuffer *)0x0;
      }
      else if (((((in_RDI->ppi->use_svc == 0) || ((in_RDI->svc).force_zero_mode_spatial_ref == 0))
                || ((in_RDI->ppi->rtc_ref).set_ref_frame_config == 0)) ||
               ((((local_25 != '\x01' || ((in_RDI->svc).skip_mvsearch_last == 0)) &&
                 ((local_25 != '\x04' || ((in_RDI->svc).skip_mvsearch_gf == 0)))) &&
                ((local_25 != '\a' || ((in_RDI->svc).skip_mvsearch_altref == 0)))))) &&
              ((iVar5 = is_one_pass_rt_params
                                  ((AV1_COMP *)
                                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)),
               iVar5 == 0 ||
               (((((in_RDI->oxcf).superres_cfg.enable_superres & 1U) == 0 || (local_25 != '\x04'))
                || ((int)((in_RDI->common).current_frame.frame_number - 1) <=
                    (in_RDI->rc).frame_num_last_gf_refresh)))))) {
        ref_frame_00 = (MV_REFERENCE_FRAME)((uint)in_stack_ffffffffffffff5c >> 0x18);
        if (((pYVar6->field_2).field_0.y_crop_width == (in_RDI->common).width) &&
           ((pYVar6->field_3).field_0.y_crop_height == (in_RDI->common).height)) {
          pRVar7 = get_ref_frame_buf((AV1_COMMON *)
                                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                     ref_frame_00);
          (pRVar7->buf).field_2.field_0.y_crop_width = (pYVar6->field_2).field_0.y_crop_width;
          (pRVar7->buf).field_3.field_0.y_crop_height = (pYVar6->field_3).field_0.y_crop_height;
          in_RDI->scaled_ref_buf[local_25 + -1] = pRVar7;
          pRVar7->ref_count = pRVar7->ref_count + 1;
        }
        else {
          if ((((in_RDI->common).width < (pYVar6->field_2).field_0.y_crop_width) ||
              ((in_RDI->common).height < (pYVar6->field_3).field_0.y_crop_height)) &&
             (pYVar6->border < 0x120)) {
            get_ref_frame_buf((AV1_COMMON *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              ref_frame_00);
            iVar5 = aom_yv12_realloc_with_new_border_c
                              ((YV12_BUFFER_CONFIG *)CONCAT44(force_scaling,in_stack_00000060),
                               new_fb._4_4_,(int)new_fb,new_fb_idx._3_1_,in_stack_00000050);
            if (iVar5 != 0) {
              aom_internal_error((in_RDI->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate frame buffer");
            }
          }
          bVar2 = false;
          local_50 = in_RDI->scaled_ref_buf[local_25 + -1];
          if (local_50 == (RefCntBuffer *)0x0) {
            iVar5 = get_free_fb(in_stack_ffffffffffffff70);
            if (iVar5 == -1) {
              aom_internal_error((in_RDI->common).error,AOM_CODEC_MEM_ERROR,
                                 "Unable to find free frame buffer");
            }
            bVar2 = true;
            local_50 = pBVar1->frame_bufs + iVar5;
          }
          if (((bVar2) || ((local_50->buf).field_2.field_0.y_crop_width != (in_RDI->common).width))
             || ((local_50->buf).field_3.field_0.y_crop_height != (in_RDI->common).height)) {
            in_stack_ffffffffffffff60 = (in_RDI->common).features.byte_alignment;
            uVar8 = 0x120;
            in_stack_ffffffffffffff68 = 0;
            in_stack_ffffffffffffff70 = (AV1_COMMON *)0x0;
            uVar9 = 0;
            uVar10 = 0;
            uVar11 = 0;
            iVar5 = aom_realloc_frame_buffer
                              ((YV12_BUFFER_CONFIG *)ref_fb,force_scaling,in_stack_00000060,
                               new_fb._4_4_,(int)new_fb,new_fb_idx,in_stack_000000b0,
                               in_stack_000000b8,in_stack_000000c0,in_stack_000000c8,
                               in_stack_000000d0,has_optimized_scaler,in_stack_000000e0);
            if (iVar5 != 0) {
              if (bVar2) {
                local_50->ref_count = local_50->ref_count + -1;
              }
              aom_internal_error((in_RDI->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate frame buffer");
            }
            local_55 = av1_has_optimized_scaler
                                 ((pYVar6->field_2).field_0.y_crop_width,
                                  (pYVar6->field_3).field_0.y_crop_height,
                                  (local_50->buf).field_2.field_0.y_crop_width,
                                  (local_50->buf).field_3.field_0.y_crop_height);
            if (1 < iVar4) {
              local_61 = false;
              if (local_55) {
                local_61 = av1_has_optimized_scaler
                                     ((pYVar6->field_2).field_0.uv_crop_width,
                                      (pYVar6->field_3).field_0.uv_crop_height,
                                      (local_50->buf).field_2.field_0.uv_crop_width,
                                      (local_50->buf).field_3.field_0.uv_crop_height);
              }
              local_55 = local_61;
            }
            if (((in_ECX == 0) || (local_55 == false)) ||
               (((in_RDI->common).seq_params)->bit_depth != AOM_BITS_8)) {
              _Var3 = av1_resize_and_extend_frame_nonnormative
                                ((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffff8c,uVar11),
                                 (YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffff84,uVar10),
                                 (int)((ulong)uVar9 >> 0x20),(int)uVar9);
              if (!_Var3) {
                aom_internal_error((in_RDI->common).error,AOM_CODEC_MEM_ERROR,
                                   "Failed to allocate buffer during resize");
              }
            }
            else {
              (*av1_resize_and_extend_frame)(pYVar6,&local_50->buf,in_SIL,in_EDX,iVar4);
            }
            in_RDI->scaled_ref_buf[local_25 + -1] = local_50;
            alloc_frame_mvs((AV1_COMMON *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (RefCntBuffer *)CONCAT44(in_stack_ffffffffffffff5c,uVar8));
          }
        }
      }
    }
  }
  return;
}

Assistant:

void av1_scale_references(AV1_COMP *cpi, const InterpFilter filter,
                          const int phase, const int use_optimized_scaler) {
  AV1_COMMON *cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MV_REFERENCE_FRAME ref_frame;

  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    // Need to convert from AOM_REFFRAME to index into ref_mask (subtract 1).
    if (cpi->ref_frame_flags & av1_ref_frame_flag_list[ref_frame]) {
      BufferPool *const pool = cm->buffer_pool;
      const YV12_BUFFER_CONFIG *const ref =
          get_ref_frame_yv12_buf(cm, ref_frame);

      if (ref == NULL) {
        cpi->scaled_ref_buf[ref_frame - 1] = NULL;
        continue;
      }

      // For RTC-SVC: if force_zero_mode_spatial_ref is enabled, check if the
      // motion search can be skipped for the references: last, golden, altref.
      // If so, we can skip scaling that reference.
      if (cpi->ppi->use_svc && cpi->svc.force_zero_mode_spatial_ref &&
          cpi->ppi->rtc_ref.set_ref_frame_config) {
        if (ref_frame == LAST_FRAME && cpi->svc.skip_mvsearch_last) continue;
        if (ref_frame == GOLDEN_FRAME && cpi->svc.skip_mvsearch_gf) continue;
        if (ref_frame == ALTREF_FRAME && cpi->svc.skip_mvsearch_altref)
          continue;
      }
      // For RTC with superres on: golden reference only needs to be scaled
      // if it was refreshed in previous frame.
      if (is_one_pass_rt_params(cpi) &&
          cpi->oxcf.superres_cfg.enable_superres && ref_frame == GOLDEN_FRAME &&
          cpi->rc.frame_num_last_gf_refresh <
              (int)cm->current_frame.frame_number - 1) {
        continue;
      }

      if (ref->y_crop_width != cm->width || ref->y_crop_height != cm->height) {
        // Replace the reference buffer with a copy having a thicker border,
        // if the reference buffer is higher resolution than the current
        // frame, and the border is thin.
        if ((ref->y_crop_width > cm->width ||
             ref->y_crop_height > cm->height) &&
            ref->border < AOM_BORDER_IN_PIXELS) {
          RefCntBuffer *ref_fb = get_ref_frame_buf(cm, ref_frame);
          if (aom_yv12_realloc_with_new_border(
                  &ref_fb->buf, AOM_BORDER_IN_PIXELS,
                  cm->features.byte_alignment, cpi->alloc_pyramid,
                  num_planes) != 0) {
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate frame buffer");
          }
        }
        int force_scaling = 0;
        RefCntBuffer *new_fb = cpi->scaled_ref_buf[ref_frame - 1];
        if (new_fb == NULL) {
          const int new_fb_idx = get_free_fb(cm);
          if (new_fb_idx == INVALID_IDX) {
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Unable to find free frame buffer");
          }
          force_scaling = 1;
          new_fb = &pool->frame_bufs[new_fb_idx];
        }

        if (force_scaling || new_fb->buf.y_crop_width != cm->width ||
            new_fb->buf.y_crop_height != cm->height) {
          if (aom_realloc_frame_buffer(
                  &new_fb->buf, cm->width, cm->height,
                  cm->seq_params->subsampling_x, cm->seq_params->subsampling_y,
                  cm->seq_params->use_highbitdepth, AOM_BORDER_IN_PIXELS,
                  cm->features.byte_alignment, NULL, NULL, NULL, false, 0)) {
            if (force_scaling) {
              // Release the reference acquired in the get_free_fb() call above.
              --new_fb->ref_count;
            }
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate frame buffer");
          }
          bool has_optimized_scaler = av1_has_optimized_scaler(
              ref->y_crop_width, ref->y_crop_height, new_fb->buf.y_crop_width,
              new_fb->buf.y_crop_height);
          if (num_planes > 1) {
            has_optimized_scaler =
                has_optimized_scaler &&
                av1_has_optimized_scaler(
                    ref->uv_crop_width, ref->uv_crop_height,
                    new_fb->buf.uv_crop_width, new_fb->buf.uv_crop_height);
          }
#if CONFIG_AV1_HIGHBITDEPTH
          if (use_optimized_scaler && has_optimized_scaler &&
              cm->seq_params->bit_depth == AOM_BITS_8) {
            av1_resize_and_extend_frame(ref, &new_fb->buf, filter, phase,
                                        num_planes);
          } else if (!av1_resize_and_extend_frame_nonnormative(
                         ref, &new_fb->buf, (int)cm->seq_params->bit_depth,
                         num_planes)) {
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate buffer during resize");
          }
#else
          if (use_optimized_scaler && has_optimized_scaler) {
            av1_resize_and_extend_frame(ref, &new_fb->buf, filter, phase,
                                        num_planes);
          } else if (!av1_resize_and_extend_frame_nonnormative(
                         ref, &new_fb->buf, (int)cm->seq_params->bit_depth,
                         num_planes)) {
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate buffer during resize");
          }
#endif
          cpi->scaled_ref_buf[ref_frame - 1] = new_fb;
          alloc_frame_mvs(cm, new_fb);
        }
      } else {
        RefCntBuffer *buf = get_ref_frame_buf(cm, ref_frame);
        buf->buf.y_crop_width = ref->y_crop_width;
        buf->buf.y_crop_height = ref->y_crop_height;
        cpi->scaled_ref_buf[ref_frame - 1] = buf;
        ++buf->ref_count;
      }
    } else {
      if (!has_no_stats_stage(cpi)) cpi->scaled_ref_buf[ref_frame - 1] = NULL;
    }
  }
}